

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O3

QWidget * __thiscall QAccessibleWidget::widget(QAccessibleWidget *this)

{
  QWidget *pQVar1;
  QWidget *pQVar2;
  
  pQVar1 = (QWidget *)(**(code **)(*(long *)this + 0x18))();
  if (pQVar1 == (QWidget *)0x0) {
    pQVar2 = (QWidget *)0x0;
  }
  else {
    pQVar2 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar1->field_0x8 + 0x30) & 1) != 0) {
      pQVar2 = pQVar1;
    }
  }
  return pQVar2;
}

Assistant:

QWidget *QAccessibleWidget::widget() const
{
    return qobject_cast<QWidget*>(object());
}